

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTexture2Tests.cpp
# Opt level: O3

void __thiscall
gl4cts::UncommittedRegionsAccessTestCase::prepareDepthStencilFramebuffer
          (UncommittedRegionsAccessTestCase *this,Functions *gl,GLint width,GLint height)

{
  GLenum GVar1;
  int iVar2;
  char *msg;
  
  (*gl->genRenderbuffers)(1,&this->mRenderbuffer);
  GVar1 = (*gl->getError)();
  glu::checkError(GVar1,"glGenRenderbuffers",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                  ,0x63f);
  (*gl->bindRenderbuffer)(0x8d41,this->mRenderbuffer);
  GVar1 = (*gl->getError)();
  glu::checkError(GVar1,"glBindRenderbuffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                  ,0x641);
  iVar2 = (this->super_SparseTexture2CommitmentTestCase).super_SparseTextureCommitmentTestCase.
          mState.samples;
  if (iVar2 == 1) {
    (*gl->renderbufferStorage)(0x8d41,0x84f9,width,height);
    GVar1 = (*gl->getError)();
    msg = "glRenderbufferStorage";
    iVar2 = 0x645;
  }
  else {
    (*gl->renderbufferStorageMultisample)(0x8d41,iVar2,0x84f9,width,height);
    GVar1 = (*gl->getError)();
    msg = "glRenderbufferStorageMultisample";
    iVar2 = 0x64a;
  }
  glu::checkError(GVar1,msg,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                  ,iVar2);
  (*gl->genFramebuffers)
            (1,(GLuint *)
               &(this->super_SparseTexture2CommitmentTestCase).super_SparseTextureCommitmentTestCase
                .field_0x25c);
  GVar1 = (*gl->getError)();
  glu::checkError(GVar1,"glGenFramebuffers",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                  ,0x64e);
  (*gl->bindFramebuffer)
            (0x8d40,*(GLuint *)
                     &(this->super_SparseTexture2CommitmentTestCase).
                      super_SparseTextureCommitmentTestCase.field_0x25c);
  GVar1 = (*gl->getError)();
  glu::checkError(GVar1,"glBindFramebuffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                  ,0x650);
  (*gl->framebufferRenderbuffer)(0x8d40,0x821a,0x8d41,this->mRenderbuffer);
  GVar1 = (*gl->getError)();
  glu::checkError(GVar1,"glFramebufferRenderbuffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                  ,0x652);
  (*gl->viewport)(0,0,width,height);
  return;
}

Assistant:

void UncommittedRegionsAccessTestCase::prepareDepthStencilFramebuffer(const Functions& gl, GLint width, GLint height)
{
	gl.genRenderbuffers(1, &mRenderbuffer);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenRenderbuffers");
	gl.bindRenderbuffer(GL_RENDERBUFFER, mRenderbuffer);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindRenderbuffer");
	if (mState.samples == 1)
	{
		gl.renderbufferStorage(GL_RENDERBUFFER, GL_DEPTH_STENCIL, width, height);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glRenderbufferStorage");
	}
	else
	{
		gl.renderbufferStorageMultisample(GL_RENDERBUFFER, mState.samples, GL_DEPTH_STENCIL, width, height);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glRenderbufferStorageMultisample");
	}

	gl.genFramebuffers(1, &mFramebuffer);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenFramebuffers");
	gl.bindFramebuffer(GL_FRAMEBUFFER, mFramebuffer);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer");
	gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_DEPTH_STENCIL_ATTACHMENT, GL_RENDERBUFFER, mRenderbuffer);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glFramebufferRenderbuffer");
	gl.viewport(0, 0, width, height);
}